

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::TiledInputFile::TiledInputFile(TiledInputFile *this,IStream *is,int numThreads)

{
  ContextInitializer *in_RDI;
  undefined1 in_stack_ffffffffffffff5f;
  undefined1 local_90 [8];
  IStream *in_stack_ffffffffffffff78;
  ContextInitializer *in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff8c;
  ContextInitializer *in_stack_ffffffffffffff90;
  exr_read_func_ptr_t in_stack_ffffffffffffff98;
  TiledInputFile *in_stack_ffffffffffffffa0;
  
  IStream::fileName((IStream *)0x234ee8);
  memset(local_90,0,0x78);
  ContextInitializer::ContextInitializer((ContextInitializer *)local_90);
  ContextInitializer::silentHeaderParse(in_RDI,(bool)in_stack_ffffffffffffff5f);
  ContextInitializer::strictHeaderValidation(in_RDI,(bool)in_stack_ffffffffffffff5f);
  ContextInitializer::setInputStream(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  TiledInputFile(in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,
                 in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  return;
}

Assistant:

TiledInputFile::TiledInputFile (
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is, int numThreads)
    : TiledInputFile (
        is.fileName (),
        ContextInitializer ()
        .silentHeaderParse (true)
        .strictHeaderValidation (false)
        .setInputStream (&is),
        numThreads)
{
}